

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O3

BigInt * __thiscall BigInt::multiply(BigInt *__return_storage_ptr__,BigInt *this,BigInt *b)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  BigInt local_68;
  BigInt local_48;
  
  BigInt(&local_48,0);
  bVar1 = operator==(this,&local_48);
  bVar2 = true;
  if (!bVar1) {
    BigInt(&local_68,0);
    bVar2 = operator==(b,&local_68);
    if (local_68.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_68.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_48.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (bVar2 == false) {
    karatsuba(__return_storage_ptr__,this,this,b);
    get_real_length(__return_storage_ptr__);
    uVar3 = (uint)((b->sign == 0) != (this->sign == 0));
    __return_storage_ptr__->sign = uVar3;
    *(__return_storage_ptr__->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start = uVar3;
  }
  else {
    BigInt(__return_storage_ptr__,0);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::multiply(BigInt& b) {
    if (*this == 0 || b == 0) {
        return BigInt(0);
    }
    BigInt temp = this->karatsuba(*this, b);
    temp.get_real_length();
    temp.set_sign(this->get_positive_sign() == b.get_positive_sign() ? true : false);
    return temp;
}